

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusAnalyzer.cpp
# Opt level: O2

void __thiscall ModbusAnalyzer::~ModbusAnalyzer(ModbusAnalyzer *this)

{
  ModbusAnalyzerResults *pMVar1;
  ModbusAnalyzerSettings *pMVar2;
  
  *(undefined ***)this = &PTR__ModbusAnalyzer_00120ca8;
  Analyzer::KillThread();
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->mSampleOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            );
  ModbusSimulationDataGenerator::~ModbusSimulationDataGenerator(&this->mSimulationDataGenerator);
  pMVar1 = (this->mResults)._M_ptr;
  if (pMVar1 != (ModbusAnalyzerResults *)0x0) {
    (**(code **)(*(long *)pMVar1 + 8))();
  }
  pMVar2 = (this->mSettings)._M_ptr;
  if (pMVar2 != (ModbusAnalyzerSettings *)0x0) {
    (**(code **)(*(long *)pMVar2 + 8))();
  }
  Analyzer::~Analyzer((Analyzer *)this);
  return;
}

Assistant:

ModbusAnalyzer::~ModbusAnalyzer()
{
    KillThread();
}